

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_linear.h
# Opt level: O1

void XrMatrix4x4f_CreateTranslationRotationScale
               (XrMatrix4x4f *result,XrVector3f *translation,XrQuaternionf *rotation,
               XrVector3f *scale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  fVar1 = scale->x;
  fVar4 = scale->y;
  fVar18 = rotation->x;
  fVar2 = rotation->y;
  fVar13 = fVar2 + fVar2;
  fVar12 = rotation->z;
  fVar19 = fVar12 + fVar12;
  fVar3 = rotation->w;
  fVar11 = (fVar18 + fVar18) * fVar3;
  fVar21 = (1.0 - fVar2 * fVar13) - fVar12 * fVar19;
  fVar5 = fVar18 * fVar13 + fVar3 * fVar19;
  fVar10 = fVar19 * fVar18 - fVar13 * fVar3;
  fVar17 = fVar18 * fVar13 - fVar3 * fVar19;
  fVar25 = 1.0 - fVar18 * (fVar18 + fVar18);
  fVar24 = fVar25 - fVar12 * fVar19;
  fVar26 = fVar2 * fVar19 + fVar11;
  fVar20 = fVar19 * fVar18 + fVar13 * fVar3;
  fVar11 = fVar2 * fVar19 - fVar11;
  fVar25 = fVar25 - fVar2 * fVar13;
  fVar12 = fVar17 * 0.0;
  fVar14 = fVar24 * 0.0;
  fVar22 = fVar21 * 0.0;
  fVar23 = fVar22 + fVar12;
  fVar6 = fVar5 * 0.0;
  fVar7 = fVar6 + fVar14;
  fVar2 = fVar26 * 0.0;
  fVar8 = fVar10 * 0.0;
  fVar9 = fVar8 + fVar2;
  fVar3 = fVar20 * 0.0;
  fVar18 = scale->z;
  fVar13 = fVar11 * 0.0;
  fVar19 = fVar25 * 0.0;
  fVar21 = fVar21 * fVar1 + fVar12 + fVar3 + 0.0;
  fVar14 = fVar5 * fVar1 + fVar14 + fVar13 + 0.0;
  fVar15 = fVar10 * fVar1 + fVar2 + fVar19 + 0.0;
  fVar16 = fVar1 * 0.0 + 0.0 + 0.0;
  fVar10 = fVar14 * 0.0;
  fVar5 = fVar15 * 0.0;
  fVar1 = translation->x;
  fVar2 = translation->y;
  fVar12 = translation->z;
  result->m[0] = fVar1 * fVar16 + fVar21 + fVar10 + fVar5;
  fVar21 = fVar21 * 0.0;
  result->m[1] = fVar2 * fVar16 + fVar14 + fVar21 + fVar5;
  fVar21 = fVar21 + fVar10;
  result->m[2] = fVar12 * fVar16 + fVar15 + fVar21;
  result->m[3] = fVar21 + fVar5 + fVar16;
  fVar21 = fVar17 * fVar4 + fVar22 + fVar3 + 0.0;
  fVar10 = fVar24 * fVar4 + fVar6 + fVar13 + 0.0;
  fVar8 = fVar26 * fVar4 + fVar8 + fVar19 + 0.0;
  fVar6 = fVar4 * 0.0 + 0.0;
  fVar5 = fVar10 * 0.0;
  fVar4 = fVar8 * 0.0;
  result->m[4] = fVar1 * fVar6 + fVar21 + fVar5 + fVar4;
  fVar21 = fVar21 * 0.0;
  result->m[5] = fVar2 * fVar6 + fVar10 + fVar21 + fVar4;
  fVar21 = fVar21 + fVar5;
  fVar15 = fVar23 + fVar3 + 0.0;
  fVar5 = fVar7 + fVar13 + 0.0;
  fVar3 = fVar9 + fVar19 + 0.0;
  result->m[6] = fVar12 * fVar6 + fVar8 + fVar21;
  fVar10 = fVar5 * 0.0;
  fVar8 = fVar3 * 0.0;
  fVar14 = fVar20 * fVar18 + fVar23 + 0.0;
  fVar13 = fVar11 * fVar18 + fVar7 + 0.0;
  fVar19 = fVar25 * fVar18 + fVar9 + 0.0;
  fVar7 = fVar18 * 0.0 + 0.0 + 0.0;
  result->m[7] = fVar21 + fVar4 + fVar6;
  fVar4 = fVar13 * 0.0;
  fVar18 = fVar19 * 0.0;
  result->m[8] = fVar1 * fVar7 + fVar14 + fVar4 + fVar18;
  fVar14 = fVar14 * 0.0;
  fVar11 = fVar15 * 0.0;
  result->m[9] = fVar2 * fVar7 + fVar13 + fVar14 + fVar18;
  fVar14 = fVar14 + fVar4;
  fVar4 = fVar11 + fVar10;
  result->m[10] = fVar12 * fVar7 + fVar19 + fVar14;
  result->m[0xb] = fVar14 + fVar18 + fVar7;
  result->m[0xc] = fVar15 + fVar10 + fVar8 + fVar1;
  result->m[0xd] = fVar5 + fVar11 + fVar8 + fVar2;
  result->m[0xe] = fVar3 + fVar4 + fVar12;
  result->m[0xf] = fVar4 + fVar8 + 1.0;
  return;
}

Assistant:

inline static void XrMatrix4x4f_CreateTranslationRotationScale(XrMatrix4x4f* result, const XrVector3f* translation,
                                                               const XrQuaternionf* rotation, const XrVector3f* scale) {
    XrMatrix4x4f scaleMatrix;
    XrMatrix4x4f_CreateScale(&scaleMatrix, scale->x, scale->y, scale->z);

    XrMatrix4x4f rotationMatrix;
    XrMatrix4x4f_CreateFromQuaternion(&rotationMatrix, rotation);

    XrMatrix4x4f translationMatrix;
    XrMatrix4x4f_CreateTranslation(&translationMatrix, translation->x, translation->y, translation->z);

    XrMatrix4x4f combinedMatrix;
    XrMatrix4x4f_Multiply(&combinedMatrix, &rotationMatrix, &scaleMatrix);
    XrMatrix4x4f_Multiply(result, &translationMatrix, &combinedMatrix);
}